

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O1

TempFile * __thiscall
TempFile::Create(TempFile *__return_storage_ptr__,TempFile *this,string_view base_template)

{
  FILE **ppFVar1;
  TempFile *pTVar2;
  int __fd;
  char *pcVar3;
  size_t __n;
  FILE *pFVar4;
  undefined8 extraout_RAX;
  void *__src;
  ulong uVar5;
  ptrdiff_t _Num;
  char *unaff_R14;
  char *unaff_R15;
  char *pcVar6;
  long *local_60;
  long local_58;
  long local_50 [2];
  TempFile *local_40;
  TempFile *local_38;
  ptrdiff_t _Num_1;
  
  __src = (void *)base_template._M_len;
  pcVar6 = this[-1].path.field_2._M_local_buf + 10;
  if (this < (TempFile *)0x6) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar6
               ,this);
LAB_0010310e:
    Create();
  }
  else {
    local_40 = __return_storage_ptr__;
    if (*(short *)(pcVar6 + (long)__src + 4) != 0x5858 ||
        *(int *)((long)__src + (long)pcVar6) != 0x58585858) goto LAB_0010310e;
    pcVar3 = getenv("TMPDIR");
    pcVar6 = "/tmp";
    if (pcVar3 != (char *)0x0) {
      pcVar6 = pcVar3;
    }
    __n = strlen(pcVar6);
    uVar5 = (long)&this->f + __n + 2;
    local_38 = this;
    unaff_R14 = (char *)operator_new__(uVar5);
    if (__n != 0) {
      memmove(unaff_R14,pcVar6,__n);
    }
    pTVar2 = local_38;
    unaff_R15 = unaff_R14 + __n;
    unaff_R14[__n] = '/';
    memcpy(unaff_R14 + __n + 1,__src,(size_t)local_38);
    (unaff_R15 + (long)pTVar2)[1] = '\0';
    if (unaff_R15 + (long)pTVar2 + 2 == unaff_R14 + uVar5) {
      __fd = mkstemp(unaff_R14);
      if (-1 < __fd) {
        ppFVar1 = &local_38->f;
        pFVar4 = fdopen(__fd,"r+");
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,unaff_R14,unaff_R14 + (long)ppFVar1 + __n + 1);
        pTVar2 = local_40;
        local_40->f = (FILE *)pFVar4;
        (local_40->path)._M_dataplus._M_p = (pointer)&(local_40->path).field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40->path,local_60,local_58 + (long)local_60);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        operator_delete__(unaff_R14);
        return pTVar2;
      }
      perror("mkstemp");
      goto LAB_00103118;
    }
  }
  Create();
LAB_00103118:
  Create();
  if (local_60 != (long *)unaff_R15) {
    operator_delete(local_60,local_50[0] + 1);
  }
  operator_delete__(unaff_R14);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static TempFile Create(std::string_view base_template) {
    CHECK_EQ(base_template.substr(base_template.size() - 6), "XXXXXX");

    const char* raw_tmpdir = getenv("TMPDIR");
    if (raw_tmpdir == nullptr) {
      raw_tmpdir = "/tmp";
    }
    std::string_view tmpdir{raw_tmpdir};
    size_t len = tmpdir.size() + 1 + base_template.size() + 1;
    std::unique_ptr<char[]> path_template{new char[len]};
    auto it = std::copy(tmpdir.begin(), tmpdir.end(), path_template.get());
    *it++ = '/';
    it = std::copy(base_template.begin(), base_template.end(), it);
    *it++ = '\0';
    CHECK_EQ(it, path_template.get() + len);

    int fd = mkstemp(path_template.get());
    if (fd < 0) {
      perror("mkstemp");
    }
    CHECK_GE(fd, 0);

    return TempFile{fdopen(fd, "r+"), std::string(path_template.get(), len-1)};
  }